

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void var_smul_rwnaf(pt_aff_t_conflict3 *out,uchar *scalar,pt_aff_t_conflict3 *P)

{
  pt_prj_t_conflict3 precomp [16];
  pt_prj_t_conflict3 lut;
  pt_prj_t_conflict3 Q;
  int8_t rnaf [103];
  int is_neg;
  int diff;
  int d;
  int j;
  int i;
  pt_aff_t_conflict3 *in_stack_fffffffffffff1e8;
  pt_prj_t_conflict3 *in_stack_fffffffffffff1f0;
  uint64_t *in_stack_fffffffffffff228;
  uint64_t *in_stack_fffffffffffff230;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffff23f;
  uint64_t *in_stack_fffffffffffff240;
  undefined1 auStack_d98 [64];
  uint64_t *in_stack_fffffffffffff2a8;
  uint64_t *in_stack_fffffffffffff2b0;
  uint64_t *in_stack_fffffffffffff2e8;
  uint64_t *in_stack_fffffffffffff2f0;
  pt_prj_t_conflict3 *in_stack_fffffffffffff368;
  pt_prj_t_conflict3 *in_stack_fffffffffffff370;
  pt_prj_t_conflict3 *in_stack_fffffffffffff3b0;
  pt_prj_t_conflict3 *in_stack_fffffffffffff3b8;
  pt_prj_t_conflict3 *in_stack_fffffffffffff3c0;
  undefined1 local_218 [128];
  undefined1 auStack_198 [64];
  undefined1 local_158 [192];
  char local_98 [102];
  char local_32;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  
  memset(local_98,0,0x67);
  memset(local_158,0,0xc0);
  memset(local_218,0,0xc0);
  precomp_wnaf(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  scalar_rwnaf((int8_t *)in_stack_fffffffffffff1f0,(uchar *)in_stack_fffffffffffff1e8);
  local_24 = local_32 + -1 >> 1;
  for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
    local_28 = 1U - ((int)-(local_24 ^ local_20) >> 0x1f) & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
              (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
               in_stack_fffffffffffff228);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
              (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
               in_stack_fffffffffffff228);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
              (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
               in_stack_fffffffffffff228);
  }
  for (local_1c = 0x65; -1 < local_1c; local_1c = local_1c + -1) {
    for (local_20 = 0; (int)local_20 < 5; local_20 = local_20 + 1) {
      point_double(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
    }
    local_2c = (int)local_98[local_1c] >> 0x1f & 1;
    local_24 = (int)(((int)local_98[local_1c] ^ -local_2c) + local_2c + -1) >> 1;
    for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
      local_28 = 1U - ((int)-(local_24 ^ local_20) >> 0x1f) & 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
                 in_stack_fffffffffffff228);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
                 in_stack_fffffffffffff228);
      fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
                 in_stack_fffffffffffff228);
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetB_opp
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
              (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
               in_stack_fffffffffffff228);
    point_add_proj(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
  }
  memcpy(local_218,&stack0xfffffffffffff1e8,0x40);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8)
  ;
  memcpy(auStack_198,auStack_d98,0x40);
  point_add_proj(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
             in_stack_fffffffffffff228);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
             in_stack_fffffffffffff228);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffff240,in_stack_fffffffffffff23f,in_stack_fffffffffffff230,
             in_stack_fffffffffffff228);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8)
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            ((uint64_t *)precomp[6].Y[6],(uint64_t *)precomp[6].Y[5],(uint64_t *)precomp[6].Y[4]);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            ((uint64_t *)precomp[6].Y[6],(uint64_t *)precomp[6].Y[5],(uint64_t *)precomp[6].Y[4]);
  return;
}

Assistant:

static void var_smul_rwnaf(pt_aff_t *out, const unsigned char scalar[64],
                           const pt_aff_t *P) {
    int i, j, d, diff, is_neg;
    int8_t rnaf[103] = {0};
    pt_prj_t Q = {0}, lut = {0};
    pt_prj_t precomp[DRADIX / 2];

    precomp_wnaf(precomp, P);
    scalar_rwnaf(rnaf, scalar);

#if defined(_MSC_VER)
    /* result still unsigned: yes we know */
#pragma warning(push)
#pragma warning(disable : 4146)
#endif

    /* initialize accumulator to high digit */
    d = (rnaf[102] - 1) >> 1;
    for (j = 0; j < DRADIX / 2; j++) {
        diff = (1 - (-(d ^ j) >> (8 * sizeof(int) - 1))) & 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.X, diff, Q.X,
                                                            precomp[j].X);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.Y, diff, Q.Y,
                                                            precomp[j].Y);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.T, diff, Q.T,
                                                            precomp[j].T);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.Z, diff, Q.Z,
                                                            precomp[j].Z);
    }

    for (i = 101; i >= 0; i--) {
        for (j = 0; j < RADIX; j++) point_double(&Q, &Q);
        d = rnaf[i];
        /* is_neg = (d < 0) ? 1 : 0 */
        is_neg = (d >> (8 * sizeof(int) - 1)) & 1;
        /* d = abs(d) */
        d = (d ^ -is_neg) + is_neg;
        d = (d - 1) >> 1;
        for (j = 0; j < DRADIX / 2; j++) {
            diff = (1 - (-(d ^ j) >> (8 * sizeof(int) - 1))) & 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(
                lut.X, diff, lut.X, precomp[j].X);
            fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(
                lut.Y, diff, lut.Y, precomp[j].Y);
            fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(
                lut.T, diff, lut.T, precomp[j].T);
            fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(
                lut.Z, diff, lut.Z, precomp[j].Z);
        }
        /* negate lut point if digit is negative */
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(out->X, lut.X);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(out->T, lut.T);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.X, is_neg,
                                                            lut.X, out->X);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.T, is_neg,
                                                            lut.T, out->T);
        point_add_proj(&Q, &Q, &lut);
    }

#if defined(_MSC_VER)
#pragma warning(pop)
#endif

    /* conditionally subtract P if the scalar was even */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(lut.X, precomp[0].X);
    fe_copy(lut.Y, precomp[0].Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(lut.T, precomp[0].T);
    fe_copy(lut.Z, precomp[0].Z);
    point_add_proj(&lut, &lut, &Q);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.X, scalar[0] & 1,
                                                        lut.X, Q.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.Y, scalar[0] & 1,
                                                        lut.Y, Q.Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.T, scalar[0] & 1,
                                                        lut.T, Q.T);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.Z, scalar[0] & 1,
                                                        lut.Z, Q.Z);

    point_double(&Q, &Q);
    point_double(&Q, &Q);

    /* move from Edwards projective to legacy projective */
    point_edwards2legacy(&Q, &Q);
    /* convert to affine -- NB depends on coordinate system */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(Q.Z, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out->X, Q.X, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out->Y, Q.Y, Q.Z);
}